

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Path * __thiscall Path::parentDir(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t __length;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  Path copy;
  Path *this_local;
  
  copy.super_String.mString.field_2._8_8_ = this;
  bVar1 = String::isEmpty(&this->super_String);
  if (bVar1) {
    Path(__return_storage_ptr__);
  }
  else {
    sVar3 = String::size(&this->super_String);
    if ((sVar3 == 1) && (cVar2 = String::at(&this->super_String,0), cVar2 == '/')) {
      Path(__return_storage_ptr__);
    }
    else {
      Path((Path *)local_38,this);
      sVar3 = String::size((String *)local_38);
      local_3c = (int)sVar3;
      __length = extraout_RDX;
      do {
        local_3c = local_3c + -1;
        bVar1 = false;
        if (-1 < local_3c) {
          cVar2 = String::at((String *)local_38,(long)local_3c);
          bVar1 = cVar2 == '/';
          __length = extraout_RDX_00;
        }
      } while (bVar1);
      while( true ) {
        bVar1 = false;
        if (-1 < local_3c) {
          cVar2 = String::at((String *)local_38,(long)local_3c);
          bVar1 = cVar2 != '/';
          __length = extraout_RDX_01;
        }
        if (!bVar1) break;
        local_3c = local_3c + -1;
      }
      if (local_3c < 0) {
        Path(__return_storage_ptr__);
      }
      else {
        String::truncate((String *)local_38,(char *)(long)(local_3c + 1),__length);
        bVar1 = String::endsWith((String *)local_38,'/',CaseSensitive);
        if (!bVar1) {
          __assert_fail("copy.endsWith(\'/\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp"
                        ,0x37,"Path Path::parentDir() const");
        }
        Path(__return_storage_ptr__,(Path *)local_38);
      }
      ~Path((Path *)local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parentDir() const
{
    if (isEmpty())
        return Path();
    if (size() == 1 && at(0) == '/')
        return Path();
    Path copy = *this;
    int i = copy.size() - 1;
    while (i >= 0 && copy.at(i) == '/')
        --i;
    while (i >= 0 && copy.at(i) != '/')
        --i;
    if (i < 0)
        return Path();
    copy.truncate(i + 1);
    assert(copy.endsWith('/'));
    return copy;
}